

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::replace_illegal_names
          (CompilerGLSL *this,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keywords)

{
  uint uVar1;
  size_t sVar2;
  Variant *pVVar3;
  bool bVar4;
  int iVar5;
  SPIRVariable *var;
  Meta *pMVar6;
  const_iterator cVar7;
  SPIRType *pSVar8;
  char *pcVar9;
  long lVar10;
  TypedID<(spirv_cross::Types)0> *id;
  TypedID<(spirv_cross::Types)0> *pTVar11;
  Decoration *memb;
  Decoration *__k;
  LoopLock loop_lock;
  LoopLock local_70;
  ParsedIR *local_68;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_60;
  TypedID<(spirv_cross::Types)0> *local_58;
  string local_50;
  
  local_68 = &(this->super_Compiler).ir;
  local_60 = &keywords->_M_h;
  ParsedIR::create_loop_hard_lock(local_68);
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar11 = (this->super_Compiler).ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar10 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar11->id + lVar10);
      pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar3[uVar1].type == TypeVariable) {
        var = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar1);
        bVar4 = Compiler::is_hidden_variable(&this->super_Compiler,var,false);
        if (!bVar4) {
          pMVar6 = ParsedIR::find_meta(local_68,(ID)(var->super_IVariant).self.id);
          if (pMVar6 != (Meta *)0x0) {
            pcVar9 = "gl_";
            iVar5 = ::std::__cxx11::string::compare((ulong)pMVar6,0,(char *)0x3);
            if (iVar5 != 0) {
              cVar7 = ::std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::find(local_60,(key_type *)pMVar6);
              if (cVar7.
                  super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ._M_cur == (__node_type *)0x0) goto LAB_001b773d;
            }
            join<char_const(&)[2],std::__cxx11::string&>
                      (&local_50,(spirv_cross *)0x2e7de5,(char (*) [2])pMVar6,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar9);
            ::std::__cxx11::string::operator=((string *)pMVar6,(string *)&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
        }
      }
LAB_001b773d:
      lVar10 = lVar10 + 4;
    } while (sVar2 << 2 != lVar10);
  }
  ParsedIR::LoopLock::~LoopLock(&local_70);
  ParsedIR::create_loop_hard_lock(local_68);
  sVar2 = (this->super_Compiler).ir.ids_for_type[1].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar11 = (this->super_Compiler).ir.ids_for_type[1].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_58 = pTVar11 + sVar2;
    do {
      pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar3[pTVar11->id].type == TypeType) {
        pSVar8 = Variant::get<spirv_cross::SPIRType>(pVVar3 + pTVar11->id);
        pMVar6 = ParsedIR::find_meta(local_68,(ID)(pSVar8->super_IVariant).self.id);
        if (pMVar6 != (Meta *)0x0) {
          pcVar9 = "gl_";
          iVar5 = ::std::__cxx11::string::compare((ulong)pMVar6,0,(char *)0x3);
          if (iVar5 == 0) {
LAB_001b7802:
            join<char_const(&)[2],std::__cxx11::string&>
                      (&local_50,(spirv_cross *)0x2e7de5,(char (*) [2])pMVar6,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar9);
            ::std::__cxx11::string::operator=((string *)pMVar6,(string *)&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
          else {
            cVar7 = ::std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find(local_60,(key_type *)pMVar6);
            if (cVar7.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur != (__node_type *)0x0) goto LAB_001b7802;
          }
          sVar2 = (pMVar6->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size;
          if (sVar2 != 0) {
            __k = (pMVar6->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
            lVar10 = sVar2 * 0x160;
            do {
              pcVar9 = "gl_";
              iVar5 = ::std::__cxx11::string::compare((ulong)__k,0,(char *)0x3);
              if (iVar5 == 0) {
LAB_001b7871:
                join<char_const(&)[2],std::__cxx11::string&>
                          (&local_50,(spirv_cross *)0x2e7de5,(char (*) [2])__k,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pcVar9);
                ::std::__cxx11::string::operator=((string *)__k,(string *)&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p);
                }
              }
              else {
                cVar7 = ::std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::find(local_60,&__k->alias);
                if (cVar7.
                    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ._M_cur != (__node_type *)0x0) goto LAB_001b7871;
              }
              __k = __k + 1;
              lVar10 = lVar10 + -0x160;
            } while (lVar10 != 0);
          }
        }
      }
      pTVar11 = pTVar11 + 1;
    } while (pTVar11 != local_58);
  }
  ParsedIR::LoopLock::~LoopLock(&local_70);
  return;
}

Assistant:

void CompilerGLSL::replace_illegal_names(const unordered_set<string> &keywords)
{
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		if (is_hidden_variable(var))
			return;

		auto *meta = ir.find_meta(var.self);
		if (!meta)
			return;

		auto &m = meta->decoration;
		if (m.alias.compare(0, 3, "gl_") == 0 || keywords.find(m.alias) != end(keywords))
			m.alias = join("_", m.alias);
	});

	ir.for_each_typed_id<SPIRType>([&](uint32_t, const SPIRType &type) {
		auto *meta = ir.find_meta(type.self);
		if (!meta)
			return;

		auto &m = meta->decoration;
		if (m.alias.compare(0, 3, "gl_") == 0 || keywords.find(m.alias) != end(keywords))
			m.alias = join("_", m.alias);

		for (auto &memb : meta->members)
			if (memb.alias.compare(0, 3, "gl_") == 0 || keywords.find(memb.alias) != end(keywords))
				memb.alias = join("_", memb.alias);
	});
}